

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

void issue32(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  char *pcVar8;
  runtime_error *prVar9;
  ostream *this;
  undefined1 auVar10 [16];
  bool ok;
  double x;
  string a;
  bool success;
  char *start;
  int64_t exp_number;
  uchar digit_3;
  bool neg_exp;
  int digit_count;
  uchar digit_2;
  uchar digit_1;
  char *first_after_period;
  int64_t exponent;
  uchar digit;
  uint64_t i;
  char *start_digits;
  bool negative;
  bool found_minus;
  char *pinit;
  double d;
  uint64_t real_exponent;
  uint64_t mantissa;
  uint64_t upperbit;
  uint64_t product_middle;
  uint64_t product_high;
  uint64_t product_middle1;
  uint64_t product_middle2;
  uint64_t product_low;
  uint64_t factor_mantissa_low;
  uint64_t upper;
  uint64_t lower;
  value128 product;
  int lz;
  int64_t exponent_1;
  uint64_t factor_mantissa;
  double d_1;
  __uint128_t r_1;
  value128 answer_1;
  __uint128_t r;
  value128 answer;
  double *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  bool local_21a;
  double local_210;
  ulong local_200;
  double local_1e8 [3];
  allocator local_1c9;
  string local_1c8 [39];
  byte local_1a1;
  char *local_1a0;
  ulong local_198;
  byte local_18a;
  byte local_189;
  int local_188;
  byte local_182;
  byte local_181;
  char *local_180;
  long local_178;
  byte local_169;
  ulong local_168;
  char *local_160;
  byte local_152;
  undefined1 local_151;
  char *local_150;
  double *local_148;
  char *local_140;
  char *local_138;
  double local_130;
  ulong local_128;
  double local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  long local_f8;
  ulong local_f0;
  undefined1 local_e8 [16];
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  int local_ac;
  long local_a8;
  ulong local_a0;
  double local_98;
  byte *local_90;
  byte local_81;
  ulong local_80;
  long local_78;
  double local_70;
  undefined1 local_68 [16];
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  ulong local_20;
  ulong local_18;
  undefined1 local_10 [16];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"-0",&local_1c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  local_150 = (char *)std::__cxx11::string::c_str();
  local_148 = local_1e8;
  local_151 = *local_150 == '-';
  local_152 = 0;
  local_140 = local_150;
  if ((bool)local_151) {
    local_140 = local_150 + 1;
    local_152 = 1;
    bVar7 = fast_double_parser::is_integer(*local_140);
    if (!bVar7) {
      local_138 = (char *)0x0;
      goto LAB_001076a5;
    }
  }
  local_160 = local_140;
  if (*local_140 == '0') {
    local_140 = local_140 + 1;
    bVar7 = fast_double_parser::is_integer(*local_140);
    if (bVar7) {
      local_138 = (char *)0x0;
      goto LAB_001076a5;
    }
    local_168 = 0;
  }
  else {
    bVar7 = fast_double_parser::is_integer(*local_140);
    if (!bVar7) {
      local_138 = (char *)0x0;
      goto LAB_001076a5;
    }
    local_169 = *local_140 - 0x30;
    local_168 = (ulong)local_169;
    while( true ) {
      local_140 = local_140 + 1;
      bVar7 = fast_double_parser::is_integer(*local_140);
      if (!bVar7) break;
      local_169 = *local_140 - 0x30;
      local_168 = local_168 * 10 + (ulong)local_169;
    }
  }
  local_178 = 0;
  local_180 = (char *)0x0;
  if (*local_140 == '.') {
    local_180 = local_140 + 1;
    local_140 = local_180;
    bVar7 = fast_double_parser::is_integer(*local_180);
    if (!bVar7) {
      local_138 = (char *)0x0;
      goto LAB_001076a5;
    }
    local_181 = *local_140 - 0x30;
    local_168 = local_168 * 10 + (ulong)local_181;
    while( true ) {
      local_140 = local_140 + 1;
      bVar7 = fast_double_parser::is_integer(*local_140);
      if (!bVar7) break;
      local_182 = *local_140 - 0x30;
      local_168 = local_168 * 10 + (ulong)local_182;
    }
    local_178 = (long)local_180 - (long)local_140;
  }
  local_188 = ((int)local_140 - (int)local_160) + -1;
  if ((*local_140 == 'e') || (*local_140 == 'E')) {
    pcVar8 = local_140 + 1;
    local_189 = 0;
    if (*pcVar8 == '-') {
      local_189 = 1;
      pcVar8 = local_140 + 2;
    }
    else if (*pcVar8 == '+') {
      pcVar8 = local_140 + 2;
    }
    local_140 = pcVar8;
    bVar7 = fast_double_parser::is_integer(*local_140);
    if (!bVar7) {
      local_138 = (char *)0x0;
      goto LAB_001076a5;
    }
    local_18a = *local_140 - 0x30;
    local_198 = (ulong)local_18a;
    local_140 = local_140 + 1;
    bVar7 = fast_double_parser::is_integer(*local_140);
    if (bVar7) {
      local_18a = *local_140 - 0x30;
      local_198 = local_198 * 10 + (ulong)local_18a;
      local_140 = local_140 + 1;
    }
    bVar7 = fast_double_parser::is_integer(*local_140);
    if (bVar7) {
      local_18a = *local_140 - 0x30;
      local_198 = local_198 * 10 + (ulong)local_18a;
      local_140 = local_140 + 1;
    }
    while (bVar7 = fast_double_parser::is_integer(*local_140), bVar7) {
      local_18a = *local_140 - 0x30;
      if ((long)local_198 < 0x100000000) {
        local_198 = local_198 * 10 + (ulong)local_18a;
      }
      local_140 = local_140 + 1;
    }
    if ((local_189 & 1) == 0) {
      local_200 = local_198;
    }
    else {
      local_200 = -local_198;
    }
    local_178 = local_200 + local_178;
  }
  if (0x12 < local_188) {
    local_1a0 = local_160;
    while( true ) {
      bVar7 = true;
      if (*local_1a0 != '0') {
        bVar7 = *local_1a0 == '.';
      }
      if (!bVar7) break;
      local_1a0 = local_1a0 + 1;
    }
    local_188 = local_188 - ((int)local_1a0 - (int)local_160);
    if (0x12 < local_188) {
      local_138 = fast_double_parser::parse_float_strtod
                            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      goto LAB_001076a5;
    }
  }
  if ((local_178 < -0x145) || (0x134 < local_178)) {
    local_138 = fast_double_parser::parse_float_strtod
                          (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    goto LAB_001076a5;
  }
  local_1a1 = 1;
  local_78 = local_178;
  local_80 = local_168;
  local_81 = local_152 & 1;
  local_90 = &local_1a1;
  if (((local_178 < -0x16) || (0x16 < local_178)) || (0x1fffffffffffff < local_168)) {
    if (local_168 == 0) {
      local_210 = -0.0;
      if (local_81 == 0) {
        local_210 = 0.0;
      }
      local_70 = local_210;
    }
    else {
      local_a0 = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                            mantissa_64 + local_178 * 8 + 0xa28);
      local_a8 = (local_178 * 0x3526a >> 0x10) + 0x43f;
      local_ac = fast_double_parser::leading_zeroes(local_168);
      auVar6._8_8_ = local_e8._8_8_;
      auVar6._0_8_ = local_e8._0_8_;
      auVar5._8_8_ = local_48._8_8_;
      auVar5._0_8_ = local_48._0_8_;
      local_80 = local_80 << ((byte)local_ac & 0x3f);
      local_20 = local_a0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_80;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_a0;
      local_38 = auVar1 * auVar3;
      local_c8 = local_38._0_8_;
      local_d0 = local_38._8_8_;
      local_c0 = local_38;
      local_18 = local_80;
      local_10 = local_38;
      if (((local_38._8_8_ & 0x1ff) == 0x1ff) &&
         (local_48 = auVar5, local_e8 = auVar6, local_38._0_8_ + local_80 < (ulong)local_38._0_8_))
      {
        local_d8 = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                              mantissa_128 + local_78 * 8 + 0xa28);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_80;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_d8;
        local_68 = auVar2 * auVar4;
        local_f0 = local_68._0_8_;
        local_f8 = local_68._8_8_;
        local_100 = local_38._0_8_;
        local_108 = local_38._8_8_;
        local_110 = local_38._0_8_ + local_68._8_8_;
        if (local_110 < (ulong)local_38._0_8_) {
          local_108 = local_38._8_8_ + 1;
        }
        local_58 = local_d8;
        local_50 = local_80;
        local_48 = local_68;
        local_e8 = local_68;
        if (((local_110 == 0xffffffffffffffff) && ((local_108 & 0x1ff) == 0x1ff)) &&
           (local_68._0_8_ + local_80 < (ulong)local_68._0_8_)) {
          local_c0 = local_68;
          *local_90 = 0;
          local_70 = 0.0;
          goto LAB_0010764b;
        }
        local_d0 = local_108;
        local_c8 = local_110;
        local_c0 = local_68;
      }
      local_118 = local_d0 >> 0x3f;
      local_120 = (double)(local_d0 >> 9 - (char)((long)local_d0 >> 0x3f));
      local_ac = ((uint)(local_d0 >> 0x3f) ^ 1) + local_ac;
      bVar7 = false;
      if ((local_c8 == 0) && (bVar7 = false, (local_d0 & 0x1ff) == 0)) {
        bVar7 = ((ulong)local_120 & 3) == 1;
      }
      if (bVar7) {
        *local_90 = 0;
        local_70 = 0.0;
      }
      else {
        local_120 = (double)(((ulong)local_120 & 1) + (long)local_120 >> 1);
        if (0x1fffffffffffff < (ulong)local_120) {
          local_120 = 0.0;
          local_ac = local_ac + -1;
        }
        local_120 = (double)((ulong)local_120 & 0xffefffffffffffff);
        local_128 = local_a8 - local_ac;
        local_21a = local_128 == 0 || 0x7fe < local_128;
        if (local_21a) {
          *local_90 = 0;
          local_70 = 0.0;
        }
        else {
          local_130 = (double)((ulong)(local_81 & 1) << 0x3f | local_128 << 0x34 | (ulong)local_120)
          ;
          local_120 = local_130;
          *local_90 = 1;
          local_70 = local_130;
        }
      }
    }
  }
  else {
    auVar10._8_4_ = (int)(local_168 >> 0x20);
    auVar10._0_8_ = local_168;
    auVar10._12_4_ = 0x45300000;
    local_98 = (auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_168) - 4503599627370496.0);
    if (local_178 < 0) {
      local_98 = local_98 /
                 *(double *)
                  (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::power_of_ten
                  + local_178 * -8);
    }
    else {
      local_98 = local_98 *
                 *(double *)
                  (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::power_of_ten
                  + local_178 * 8);
    }
    if (local_81 != 0) {
      local_98 = -local_98;
    }
    local_1a1 = 1;
    local_70 = local_98;
  }
LAB_0010764b:
  *local_148 = local_70;
  if ((local_1a1 & 1) == 0) {
    local_138 = fast_double_parser::parse_float_strtod
                          (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  }
  else {
    local_138 = local_140;
  }
LAB_001076a5:
  if (local_138 == (char *)0x0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"could not parse -zero.");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_1e8[0] == 0.0) && (!NAN(local_1e8[0]))) {
    this = std::operator<<((ostream *)&std::cout,"zero maps to zero");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1c8);
    return;
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"-zero does not map to zero.");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void issue32() {
  std::string a = "-0";
  double x;
  bool ok = fast_double_parser::parse_number(a.c_str(), &x);
  if(!ok) throw std::runtime_error("could not parse -zero.");
  if(x != 0) throw std::runtime_error("-zero does not map to zero.");
  std::cout << "zero maps to zero" << std::endl;
}